

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

int nghttp2_bufs_addb(nghttp2_bufs *bufs,uint8_t b)

{
  int iVar1;
  nghttp2_buf_chain *pnVar2;
  uint8_t *puVar3;
  
  pnVar2 = bufs->cur;
  puVar3 = (pnVar2->buf).last;
  if ((pnVar2->buf).end == puVar3) {
    iVar1 = bufs_alloc_chain(bufs);
    if (iVar1 != 0) {
      return iVar1;
    }
    pnVar2 = bufs->cur;
    puVar3 = (pnVar2->buf).last;
  }
  (pnVar2->buf).last = puVar3 + 1;
  *puVar3 = b;
  return 0;
}

Assistant:

int nghttp2_bufs_addb(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

  *bufs->cur->buf.last++ = b;

  return 0;
}